

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void absl::lts_20250127::container_internal::SetCtrlInSingleGroupTable
               (CommonFields *c,size_t i,ctrl_t h,size_t slot_size)

{
  bool bVar1;
  size_t sVar2;
  ctrl_t *pcVar3;
  ctrl_t *ctrl;
  size_t slot_size_local;
  ctrl_t h_local;
  size_t i_local;
  CommonFields *c_local;
  
  sVar2 = CommonFields::capacity(c);
  bVar1 = is_single_group(sVar2);
  if (!bVar1) {
    __assert_fail("(is_single_group(c.capacity())) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x762,
                  "void absl::container_internal::SetCtrlInSingleGroupTable(const CommonFields &, size_t, ctrl_t, size_t)"
                 );
  }
  DoSanitizeOnSetCtrl(c,i,h,slot_size);
  pcVar3 = CommonFields::control(c);
  pcVar3[i] = h;
  sVar2 = CommonFields::capacity(c);
  pcVar3[i + sVar2 + 1] = h;
  return;
}

Assistant:

inline void SetCtrlInSingleGroupTable(const CommonFields& c, size_t i, ctrl_t h,
                                      size_t slot_size) {
  ABSL_SWISSTABLE_ASSERT(is_single_group(c.capacity()));
  DoSanitizeOnSetCtrl(c, i, h, slot_size);
  ctrl_t* ctrl = c.control();
  ctrl[i] = h;
  ctrl[i + c.capacity() + 1] = h;
}